

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void __thiscall UnifiedRegex::CountDomain::Print(CountDomain *this,DebugWriter *w)

{
  Char *form;
  
  if ((this->upper == 0xffffffff) || (this->lower != this->upper)) {
    DebugWriter::Print(w,L"[%u-",(ulong)this->lower);
    if (this->upper == 0xffffffff) {
      DebugWriter::Print(w,L"inf]");
      return;
    }
    form = L"%u]";
  }
  else {
    form = L"[%u]";
  }
  DebugWriter::Print(w,form);
  return;
}

Assistant:

void CountDomain::Print(DebugWriter* w) const
    {
        if (upper != CharCountFlag && lower == (CharCount)upper)
        {
            w->Print(_u("[%u]"), lower);
        }
        else
        {
            w->Print(_u("[%u-"), lower);
            if (upper == CharCountFlag)
                w->Print(_u("inf]"));
            else
                w->Print(_u("%u]"), (CharCount)upper);
        }
    }